

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

LinkImplementationLibraries * __thiscall
cmTarget::GetLinkImplementationLibrariesInternal(cmTarget *this,string *config,cmTarget *head)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  pointer ppVar3;
  byte local_99;
  OptionalLinkImplementation *impl;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>
  local_70;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>
  local_68 [3];
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
  *local_50;
  HeadToLinkImplementationMap *hm;
  string CONFIG;
  cmTarget *head_local;
  string *config_local;
  cmTarget *this_local;
  
  CONFIG.field_2._8_8_ = head;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&hm,config);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    local_50 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap>_>_>
                ::operator[](&pcVar2->LinkImplMap,(key_type *)&hm)->
                super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
    ;
    bVar1 = std::
            map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
            ::empty(local_50);
    local_99 = 0;
    if (!bVar1) {
      local_68[0]._M_node =
           (_Base_ptr)
           std::
           map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
           ::begin(local_50);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>
               ::operator->(local_68);
      local_99 = (ppVar3->second).HadHeadSensitiveCondition ^ 0xff;
    }
    if ((local_99 & 1) == 0) {
      this_local = (cmTarget *)
                   std::
                   map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
                   ::operator[](local_50,(key_type *)((long)&CONFIG.field_2 + 8));
      if (((ulong)(this_local->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left & 1) == 0) {
        *(undefined1 *)
         &(this_local->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
          _M_left = 1;
        pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
        cmTargetInternals::ComputeLinkImplementationLibraries
                  (pcVar2,this,config,(OptionalLinkImplementation *)this_local,
                   (cmTarget *)CONFIG.field_2._8_8_);
      }
    }
    else {
      local_70._M_node =
           (_Base_ptr)
           std::
           map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
           ::begin(local_50);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>
               ::operator->(&local_70);
      this_local = (cmTarget *)&ppVar3->second;
    }
    std::__cxx11::string::~string((string *)&hm);
  }
  return (LinkImplementationLibraries *)this_local;
}

Assistant:

cmTarget::LinkImplementationLibraries const*
cmTarget::GetLinkImplementationLibrariesInternal(const std::string& config,
                                                 cmTarget const* head) const
{
  // There is no link implementation for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Populate the link implementation libraries for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::HeadToLinkImplementationMap& hm =
    this->Internal->LinkImplMap[CONFIG];

  // If the link implementation does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmTargetInternals::OptionalLinkImplementation& impl = hm[head];
  if(!impl.LibrariesDone)
    {
    impl.LibrariesDone = true;
    this->Internal
      ->ComputeLinkImplementationLibraries(this, config, impl, head);
    }
  return &impl;
}